

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void ossl_disassociate_connection(Curl_easy *data,int sockindex)

{
  byte bVar1;
  connectdata *pcVar2;
  ssl_backend_data *psVar3;
  uint idx;
  uint idx_00;
  uint idx_01;
  uint idx_02;
  
  pcVar2 = data->conn;
  psVar3 = pcVar2->ssl[sockindex].backend;
  if (psVar3->handle != (SSL *)0x0) {
    if (((pcVar2->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (pcVar2->proxy_ssl[pcVar2->sock[1] != -1].state != ssl_connection_complete)) {
      bVar1 = (data->set).proxy_ssl.primary.field_0x68;
    }
    else {
      bVar1 = (data->set).ssl.primary.field_0x68;
    }
    if ((bVar1 & 8) != 0) {
      idx = ossl_get_ssl_data_index();
      idx_00 = ossl_get_ssl_conn_index();
      idx_01 = ossl_get_ssl_sockindex_index();
      idx_02 = ossl_get_proxy_index();
      if (-1 < (int)(idx | idx_00 | idx_01 | idx_02)) {
        SSL_set_ex_data((SSL *)psVar3->handle,idx,(void *)0x0);
        SSL_set_ex_data((SSL *)psVar3->handle,idx_00,(void *)0x0);
        SSL_set_ex_data((SSL *)psVar3->handle,idx_01,(void *)0x0);
        SSL_set_ex_data((SSL *)psVar3->handle,idx_02,(void *)0x0);
        return;
      }
    }
  }
  return;
}

Assistant:

static void ossl_disassociate_connection(struct Curl_easy *data,
                                         int sockindex)
{
  struct connectdata *conn = data->conn;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;

  /* If we don't have SSL context, do nothing. */
  if(!backend->handle)
    return;

  if(SSL_SET_OPTION(primary.sessionid)) {
    int data_idx = ossl_get_ssl_data_index();
    int connectdata_idx = ossl_get_ssl_conn_index();
    int sockindex_idx = ossl_get_ssl_sockindex_index();
    int proxy_idx = ossl_get_proxy_index();

    if(data_idx >= 0 && connectdata_idx >= 0 && sockindex_idx >= 0 &&
       proxy_idx >= 0) {
      /* Disable references to data in "new session" callback to avoid
       * accessing a stale pointer. */
      SSL_set_ex_data(backend->handle, data_idx, NULL);
      SSL_set_ex_data(backend->handle, connectdata_idx, NULL);
      SSL_set_ex_data(backend->handle, sockindex_idx, NULL);
      SSL_set_ex_data(backend->handle, proxy_idx, NULL);
    }
  }
}